

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O0

iterator __thiscall
roaring::Roaring64Map::ensureRangePopulated
          (Roaring64Map *this,uint32_t start_high,uint32_t end_high)

{
  bool bVar1;
  runtime_error *this_00;
  pointer ppVar2;
  uint in_EDX;
  uint in_ESI;
  map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  *in_RDI;
  Roaring *bitmap;
  iterator slot_iter;
  uint64_t slot;
  iterator next_populated_iter;
  iterator start_iter;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  undefined4 in_stack_ffffffffffffff70;
  uint in_stack_ffffffffffffff74;
  piecewise_construct_t *in_stack_ffffffffffffff78;
  const_iterator in_stack_ffffffffffffff88;
  _Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> local_60;
  _Base_ptr local_58;
  _Base_ptr local_50;
  _Self local_48;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> local_40;
  ulong local_38;
  _Self local_30 [3];
  uint local_18;
  uint local_14;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> local_8;
  
  if (in_ESI <= in_EDX) {
    local_18 = in_EDX;
    local_14 = in_ESI;
    local_30[0]._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
         ::lower_bound((map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
                        *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
                       (key_type *)0x120074);
    std::_Rb_tree_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::_Rb_tree_iterator
              (&local_8);
    for (local_38 = (ulong)local_14; local_38 <= local_18; local_38 = local_38 + 1) {
      std::_Rb_tree_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::_Rb_tree_iterator
                (&local_40);
      local_48._M_node =
           (_Base_ptr)
           std::
           map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
           ::end((map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
                  *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
      bVar1 = std::operator!=(local_30,&local_48);
      in_stack_ffffffffffffff74 = in_stack_ffffffffffffff74 & 0xffffff;
      if (bVar1) {
        ppVar2 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::
                 operator->((_Rb_tree_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> *)
                            0x1200e8);
        in_stack_ffffffffffffff74 =
             CONCAT13(ppVar2->first == local_38,(int3)in_stack_ffffffffffffff74);
      }
      if ((char)(in_stack_ffffffffffffff74 >> 0x18) == '\0') {
        std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::
        _Rb_tree_const_iterator(&local_60,local_30);
        std::forward_as_tuple<unsigned_int>
                  ((uint *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
        std::forward_as_tuple<>();
        local_58 = (_Base_ptr)
                   std::
                   map<unsigned_int,roaring::Roaring,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,roaring::Roaring>>>
                   ::
                   emplace_hint<std::piecewise_construct_t_const&,std::tuple<unsigned_int&&>,std::tuple<>>
                             (in_RDI,in_stack_ffffffffffffff88,in_stack_ffffffffffffff78,
                              (tuple<unsigned_int_&&> *)
                              CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                              (tuple<> *)
                              CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
        local_40._M_node = local_58;
        ppVar2 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::
                 operator->((_Rb_tree_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> *)
                            0x120185);
        in_stack_ffffffffffffff88._M_node = (_Base_ptr)&ppVar2->second;
        Roaring::setCopyOnWrite
                  ((Roaring *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                   (bool)in_stack_ffffffffffffff6f);
      }
      else {
        local_50 = (_Base_ptr)
                   std::_Rb_tree_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::
                   operator++((_Rb_tree_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> *
                              )in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
        local_40._M_node = local_50;
      }
      if (local_38 == local_14) {
        local_8._M_node = local_40._M_node;
      }
    }
    return (iterator)local_8._M_node;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Logic error: start_high > end_high");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

roarings_t::iterator ensureRangePopulated(uint32_t start_high,
                                              uint32_t end_high) {
        if (start_high > end_high) {
            ROARING_TERMINATE("Logic error: start_high > end_high");
        }
        // next_populated_iter points to the first entry in the outer map with
        // key >= start_high, or end().
        auto next_populated_iter = roarings.lower_bound(start_high);

        // Use uint64_t to avoid an infinite loop when end_high == uint32_max.
        roarings_t::iterator start_iter{};  // Definitely assigned in loop.
        for (uint64_t slot = start_high; slot <= end_high; ++slot) {
            roarings_t::iterator slot_iter;
            if (next_populated_iter != roarings.end() &&
                next_populated_iter->first == slot) {
                // 'slot' index has caught up to next_populated_iter.
                // Note it here and advance next_populated_iter.
                slot_iter = next_populated_iter++;
            } else {
                // 'slot' index has not yet caught up to next_populated_iter.
                // Make a fresh entry {key = 'slot', value = Roaring()}, insert
                // it just prior to next_populated_iter, and set its copy
                // on write flag. We take pains to use emplace_hint and
                // piecewise_construct to minimize effort.
                slot_iter = roarings.emplace_hint(
                    next_populated_iter, std::piecewise_construct,
                    std::forward_as_tuple(uint32_t(slot)),
                    std::forward_as_tuple());
                auto &bitmap = slot_iter->second;
                bitmap.setCopyOnWrite(copyOnWrite);
            }

            // Make a note of the iterator of the starting slot. It will be
            // needed for the return value.
            if (slot == start_high) {
                start_iter = slot_iter;
            }
        }
        return start_iter;
    }